

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.hpp
# Opt level: O3

void __thiscall ot::commissioner::Interpreter::Value::~Value(Value *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->mData)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mData).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mError).mMessage._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mError).mMessage.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Value() = default;